

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_tls.c
# Opt level: O1

void mbedtls_ssl_recv_flight_completed(mbedtls_ssl_context *ssl)

{
  mbedtls_ssl_handshake_params *pmVar1;
  uchar uVar2;
  
  ssl_flight_free(ssl->handshake->flight);
  pmVar1 = ssl->handshake;
  pmVar1->flight = (mbedtls_ssl_flight_item *)0x0;
  pmVar1->cur_msg = (mbedtls_ssl_flight_item *)0x0;
  pmVar1->in_flight_start_seq = pmVar1->in_msg_seq;
  if (ssl->f_set_timer != (mbedtls_ssl_set_timer_t *)0x0) {
    (*ssl->f_set_timer)(ssl->p_timer,0,0);
  }
  if ((ssl->in_msgtype != 0x16) || (uVar2 = '\x03', *ssl->in_msg != '\x14')) {
    uVar2 = '\0';
  }
  ssl->handshake->retransmit_state = uVar2;
  return;
}

Assistant:

void mbedtls_ssl_recv_flight_completed( mbedtls_ssl_context *ssl )
{
    /* We won't need to resend that one any more */
    ssl_flight_free( ssl->handshake->flight );
    ssl->handshake->flight = NULL;
    ssl->handshake->cur_msg = NULL;

    /* The next incoming flight will start with this msg_seq */
    ssl->handshake->in_flight_start_seq = ssl->handshake->in_msg_seq;

    /* Cancel timer */
    ssl_set_timer( ssl, 0 );

    if( ssl->in_msgtype == MBEDTLS_SSL_MSG_HANDSHAKE &&
        ssl->in_msg[0] == MBEDTLS_SSL_HS_FINISHED )
    {
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_FINISHED;
    }
    else
        ssl->handshake->retransmit_state = MBEDTLS_SSL_RETRANS_PREPARING;
}